

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest7::iterate(NegativeTest7 *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *description;
  qpTestResult testResult;
  
  bVar1 = test(this,
               "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nsubroutine vec4 routine_type(in vec4 data);\n\nsubroutine uniform routine_type routine;\n\nvec4 function(in vec4 data)\n{\n    return routine(data) + vec4(0.5, 0.5, 0.5, 0.5);\n}\n\nsubroutine (routine_type) vec4 routine_a(in vec4 data)\n{\n    return function(data) / 2;\n}\n\nsubroutine (routine_type) vec4 routine_b(in vec4 data)\n{\n    return routine_a(data) * 2;\n}\n\nuniform vec4 uni_value;\n\nout vec4 out_result;\n\nvoid main()\n{\n    out_result = routine(uni_value);\n}\n\n"
               ,"routine_a");
  bVar2 = test(this,
               "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nsubroutine vec4 routine_type(in vec4 data);\n\nsubroutine uniform routine_type routine;\n\nsubroutine (routine_type) vec4 div_by_2(in vec4 data)\n{\n    return data / 2;\n}\n\nsubroutine (routine_type) vec4 div_routine_result_by_2(in vec4 data)\n{\n    return routine(data) / 2;\n}\n\nuniform vec4 uni_value;\n\nout vec4 out_result;\n\nvoid main()\n{\n    out_result = routine(uni_value);\n}\n\n"
               ,"div_routine_result_by_2");
  bVar3 = test(this,
               "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nsubroutine vec4 routine_type(in vec4 data, in uint control);\n\nsubroutine (routine_type) vec4 power_routine(in vec4 data, in uint control)\n{\n    if (0 != control)\n    {\n        return data * power_routine(data, control - 1);\n    }\n    else\n    {\n        return vec4(1, 1, 1, 1);\n    }\n}\n\nsubroutine (routine_type) vec4 select_routine(in vec4 data, in uint control)\n{\n    if (0 == control)\n    {\n        return data.rrrr;\n    }\n    else if (1 == control)\n    {\n        return data.gggg;\n    }\n    else if (2 == control)\n    {\n        return data.bbbb;\n    }\n    else\n    {\n        return data.aaaa;\n    }\n}\n\nsubroutine uniform routine_type routine;\n\nuniform vec4 uni_value;\nuniform uint uni_control;\n\nout vec4 out_result;\n\nvoid main()\n{\n    out_result = routine(uni_value, uni_control);\n}\n\n"
               ,"power_routine");
  if (((bVar3) && (bVar1)) && (bVar2)) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NegativeTest7::iterate()
{
	static const GLchar* vertex_shader_with_static_recursion =
		"#version 400\n"
		"\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"subroutine vec4 routine_type(in vec4 data, in uint control);\n"
		"\n"
		"subroutine (routine_type) vec4 power_routine(in vec4 data, in uint control)\n"
		"{\n"
		"    if (0 != control)\n"
		"    {\n"
		"        return data * power_routine(data, control - 1);\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        return vec4(1, 1, 1, 1);\n"
		"    }\n"
		"}\n"
		"\n"
		"subroutine (routine_type) vec4 select_routine(in vec4 data, in uint control)\n"
		"{\n"
		"    if (0 == control)\n"
		"    {\n"
		"        return data.rrrr;\n"
		"    }\n"
		"    else if (1 == control)\n"
		"    {\n"
		"        return data.gggg;\n"
		"    }\n"
		"    else if (2 == control)\n"
		"    {\n"
		"        return data.bbbb;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        return data.aaaa;\n"
		"    }\n"
		"}\n"
		"\n"
		"subroutine uniform routine_type routine;\n"
		"\n"
		"uniform vec4 uni_value;\n"
		"uniform uint uni_control;\n"
		"\n"
		"out vec4 out_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_result = routine(uni_value, uni_control);\n"
		"}\n"
		"\n";

	static const GLchar* vertex_shader_with_dynamic_recursion =
		"#version 400\n"
		"\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"subroutine vec4 routine_type(in vec4 data);\n"
		"\n"
		"subroutine uniform routine_type routine;\n"
		"\n"
		"subroutine (routine_type) vec4 div_by_2(in vec4 data)\n"
		"{\n"
		"    return data / 2;\n"
		"}\n"
		"\n"
		"subroutine (routine_type) vec4 div_routine_result_by_2(in vec4 data)\n"
		"{\n"
		"    return routine(data) / 2;\n"
		"}\n"
		"\n"
		"uniform vec4 uni_value;\n"
		"\n"
		"out vec4 out_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_result = routine(uni_value);\n"
		"}\n"
		"\n";

	static const GLchar* vertex_shader_with_subroutine_function_recursion =
		"#version 400\n"
		"\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"subroutine vec4 routine_type(in vec4 data);\n"
		"\n"
		"subroutine uniform routine_type routine;\n"
		"\n"
		"vec4 function(in vec4 data)\n"
		"{\n"
		"    return routine(data) + vec4(0.5, 0.5, 0.5, 0.5);\n"
		"}\n"
		"\n"
		"subroutine (routine_type) vec4 routine_a(in vec4 data)\n"
		"{\n"
		"    return function(data) / 2;\n"
		"}\n"
		"\n"
		"subroutine (routine_type) vec4 routine_b(in vec4 data)\n"
		"{\n"
		"    return routine_a(data) * 2;\n"
		"}\n"
		"\n"
		"uniform vec4 uni_value;\n"
		"\n"
		"out vec4 out_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_result = routine(uni_value);\n"
		"}\n"
		"\n";

	bool result = true;

	if (false == test(vertex_shader_with_subroutine_function_recursion, "routine_a"))
	{
		result = false;
	}

	if (false == test(vertex_shader_with_dynamic_recursion, "div_routine_result_by_2"))
	{
		result = false;
	}

	if (false == test(vertex_shader_with_static_recursion, "power_routine"))
	{
		result = false;
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}